

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O1

void __thiscall
spdlog::details::name_formatter::format
          (name_formatter *this,log_msg *msg,tm *param_2,memory_buffer *dest)

{
  char *pcVar1;
  scoped_pad p;
  scoped_pad sStack_38;
  
  if ((this->super_flag_formatter).padinfo_.width_ == 0) {
    pcVar1 = (msg->logger_name->_M_dataplus)._M_p;
    if (pcVar1 != (char *)0x0) {
      fmt::v5::internal::basic_buffer<char>::append<char>
                (&dest->super_basic_buffer<char>,pcVar1,pcVar1 + msg->logger_name->_M_string_length)
      ;
      return;
    }
  }
  else {
    scoped_pad::scoped_pad
              (&sStack_38,msg->logger_name->_M_string_length,&(this->super_flag_formatter).padinfo_,
               dest);
    pcVar1 = (msg->logger_name->_M_dataplus)._M_p;
    if (pcVar1 != (char *)0x0) {
      fmt::v5::internal::basic_buffer<char>::append<char>
                (&dest->super_basic_buffer<char>,pcVar1,pcVar1 + msg->logger_name->_M_string_length)
      ;
    }
    scoped_pad::~scoped_pad(&sStack_38);
  }
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, fmt::memory_buffer &dest) override
    {
        if (padinfo_.enabled())
        {
            scoped_pad p(*msg.logger_name, padinfo_, dest);
            fmt_helper::append_string_view(*msg.logger_name, dest);
        }
        else
        {
            fmt_helper::append_string_view(*msg.logger_name, dest);
        }
    }